

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> * __thiscall
vkb::PhysicalDeviceSelector::select_impl
          (Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
           *__return_storage_ptr__,PhysicalDeviceSelector *this)

{
  allocator<vkb::PhysicalDevice> *this_00;
  initializer_list<vkb::PhysicalDevice> __l;
  bool bVar1;
  GenericFeatureChain *this_01;
  reference pGVar2;
  VulkanFunctions *pVVar3;
  size_type sVar4;
  reference ppVVar5;
  iterator iVar6;
  iterator iVar7;
  reference phys_dev_00;
  error_code error_code;
  error_code error_code_00;
  error_code error_code_01;
  PhysicalDevice *local_15d8;
  PhysicalDevice *physical_device_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> *__range1_2;
  undefined1 local_1558 [8];
  PhysicalDevice phys_dev;
  VkPhysicalDevice_T **vk_physical_device;
  iterator __end1_1;
  iterator __begin1_1;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *__range1_1;
  vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> physical_devices;
  PhysicalDevice local_e50;
  iterator local_790;
  size_type local_788;
  vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> local_780;
  undefined1 local_768 [8];
  PhysicalDevice physical_device;
  anon_class_8_1_8991fb9c fill_out_phys_dev_with_criteria;
  error_category *local_98;
  error_code local_88 [2];
  VkResult local_64;
  undefined1 local_60 [4];
  VkResult vk_physical_devices_ret;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> vk_physical_devices;
  error_category *local_40;
  GenericFeaturesPNextNode *node;
  const_iterator __end1;
  const_iterator __begin1;
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  *__range1;
  PhysicalDeviceSelector *this_local;
  
  this_01 = &(this->criteria).extended_features_chain;
  __end1 = std::
           vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ::begin(&this_01->nodes);
  node = (GenericFeaturesPNextNode *)
         std::
         vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
         ::end(&this_01->nodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
                                *)&node);
    if (!bVar1) {
      if (((((this->criteria).require_present & 1U) == 0) ||
          (((this->criteria).defer_surface_initialization & 1U) != 0)) ||
         ((this->instance_info).surface != (VkSurfaceKHR)0x0)) {
        std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::vector
                  ((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *)local_60);
        pVVar3 = detail::vulkan_functions();
        local_64 = detail::
                   get_vector<VkPhysicalDevice_T*,VkResult(*&)(VkInstance_T*,unsigned_int*,VkPhysicalDevice_T**),VkInstance_T*const&>
                             ((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *
                              )local_60,
                              (_func_VkResult_VkInstance_T_ptr_uint_ptr_VkPhysicalDevice_T_ptr_ptr
                               **)&pVVar3->fp_vkEnumeratePhysicalDevices,(VkInstance_T **)this);
        if (local_64 == VK_SUCCESS) {
          sVar4 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::size
                            ((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *)
                             local_60);
          if (sVar4 == 0) {
            std::error_code::error_code<vkb::PhysicalDeviceError,void>
                      ((error_code *)&fill_out_phys_dev_with_criteria,no_physical_devices_found);
            error_code_01._4_4_ = 0;
            error_code_01._M_value = (uint)fill_out_phys_dev_with_criteria.this;
            error_code_01._M_cat = local_98;
            Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::Result
                      (__return_storage_ptr__,error_code_01,VK_SUCCESS);
          }
          else {
            physical_device._1720_8_ = this;
            if ((((this->criteria).use_first_gpu_unconditionally & 1U) == 0) ||
               (sVar4 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::
                        size((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *)
                             local_60), sVar4 == 0)) {
              std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::vector
                        ((vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> *)
                         &__range1_1);
              __end1_1 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::
                         begin((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                                *)local_60);
              vk_physical_device =
                   (VkPhysicalDevice_T **)
                   std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::end
                             ((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *
                              )local_60);
              while (bVar1 = __gnu_cxx::operator!=
                                       (&__end1_1,
                                        (__normal_iterator<VkPhysicalDevice_T_**,_std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>_>
                                         *)&vk_physical_device), bVar1) {
                phys_dev._1720_8_ =
                     __gnu_cxx::
                     __normal_iterator<VkPhysicalDevice_T_**,_std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>_>
                     ::operator*(&__end1_1);
                populate_device_details
                          ((PhysicalDevice *)local_1558,this,*(VkPhysicalDevice *)phys_dev._1720_8_,
                           &(this->criteria).extended_features_chain);
                phys_dev.extended_features_chain.nodes.
                super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                     is_device_suitable(this,(PhysicalDevice *)local_1558);
                if (phys_dev.extended_features_chain.nodes.
                    super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != no) {
                  std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::push_back
                            ((vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> *)
                             &__range1_1,(value_type *)local_1558);
                }
                PhysicalDevice::~PhysicalDevice((PhysicalDevice *)local_1558);
                __gnu_cxx::
                __normal_iterator<VkPhysicalDevice_T_**,_std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>_>
                ::operator++(&__end1_1);
              }
              iVar6 = std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::begin
                                ((vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
                                  *)&__range1_1);
              iVar7 = std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::end
                                ((vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
                                  *)&__range1_1);
              std::
              stable_partition<__gnu_cxx::__normal_iterator<vkb::PhysicalDevice*,std::vector<vkb::PhysicalDevice,std::allocator<vkb::PhysicalDevice>>>,vkb::PhysicalDeviceSelector::select_impl()const::__1>
                        (iVar6._M_current,iVar7._M_current);
              __end1_2 = std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::
                         begin((vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> *)
                               &__range1_1);
              physical_device_1 =
                   (PhysicalDevice *)
                   std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::end
                             ((vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> *)
                              &__range1_1);
              while (bVar1 = __gnu_cxx::operator!=
                                       (&__end1_2,
                                        (__normal_iterator<vkb::PhysicalDevice_*,_std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
                                         *)&physical_device_1), bVar1) {
                phys_dev_00 = __gnu_cxx::
                              __normal_iterator<vkb::PhysicalDevice_*,_std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
                              ::operator*(&__end1_2);
                select_impl::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)&physical_device.defer_surface_initialization,
                           phys_dev_00);
                __gnu_cxx::
                __normal_iterator<vkb::PhysicalDevice_*,_std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
                ::operator++(&__end1_2);
              }
              Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::
              Result(__return_storage_ptr__,
                     (vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> *)
                     &__range1_1);
              std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::~vector
                        ((vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> *)
                         &__range1_1);
            }
            else {
              ppVVar5 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::
                        operator[]((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                                    *)local_60,0);
              populate_device_details
                        ((PhysicalDevice *)local_768,this,*ppVVar5,
                         &(this->criteria).extended_features_chain);
              select_impl::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)&physical_device.defer_surface_initialization,
                         (PhysicalDevice *)local_768);
              PhysicalDevice::PhysicalDevice(&local_e50,(PhysicalDevice *)local_768);
              local_790 = &local_e50;
              local_788 = 1;
              this_00 = (allocator<vkb::PhysicalDevice> *)
                        ((long)&physical_devices.
                                super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
              std::allocator<vkb::PhysicalDevice>::allocator(this_00);
              __l._M_len = local_788;
              __l._M_array = local_790;
              std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::vector
                        (&local_780,__l,this_00);
              Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::
              Result(__return_storage_ptr__,&local_780);
              std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::~vector
                        (&local_780);
              std::allocator<vkb::PhysicalDevice>::~allocator
                        ((allocator<vkb::PhysicalDevice> *)
                         ((long)&physical_devices.
                                 super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              local_15d8 = (PhysicalDevice *)&local_790;
              do {
                local_15d8 = local_15d8 + -1;
                PhysicalDevice::~PhysicalDevice(local_15d8);
              } while (local_15d8 != &local_e50);
              PhysicalDevice::~PhysicalDevice((PhysicalDevice *)local_768);
            }
          }
        }
        else {
          std::error_code::error_code<vkb::PhysicalDeviceError,void>
                    (local_88,failed_enumerate_physical_devices);
          error_code_00._4_4_ = 0;
          error_code_00._M_value = local_88[0]._M_value;
          error_code_00._M_cat = local_88[0]._M_cat;
          Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::Result
                    (__return_storage_ptr__,error_code_00,local_64);
        }
        std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::~vector
                  ((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *)local_60);
      }
      else {
        std::error_code::error_code<vkb::PhysicalDeviceError,void>
                  ((error_code *)
                   &vk_physical_devices.
                    super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,no_surface_provided);
        error_code._4_4_ = 0;
        error_code._M_value =
             (uint)vk_physical_devices.
                   super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        error_code._M_cat = local_40;
        Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::Result
                  (__return_storage_ptr__,error_code,VK_SUCCESS);
      }
      return __return_storage_ptr__;
    }
    pGVar2 = __gnu_cxx::
             __normal_iterator<const_vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
             ::operator*(&__end1);
    if (pGVar2->sType == VK_STRUCTURE_TYPE_APPLICATION_INFO) break;
    if (pGVar2->sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2) {
      __assert_fail("node.sType != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 && \"Do not pass VkPhysicalDeviceFeatures2 as a required extension feature structure. An \" \"instance of this is managed internally for selection criteria and device creation.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                    ,0x4e1,
                    "Result<std::vector<PhysicalDevice>> vkb::PhysicalDeviceSelector::select_impl() const"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
    ::operator++(&__end1);
  }
  __assert_fail("node.sType != static_cast<VkStructureType>(0) && \"Features struct sType must be filled with the struct\'s \" \"corresponding VkStructureType enum\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                ,0x4de,
                "Result<std::vector<PhysicalDevice>> vkb::PhysicalDeviceSelector::select_impl() const"
               );
}

Assistant:

Result<std::vector<PhysicalDevice>> PhysicalDeviceSelector::select_impl() const {
#if !defined(NDEBUG)
    // Validation
    for (const auto& node : criteria.extended_features_chain.nodes) {
        assert(node.sType != static_cast<VkStructureType>(0) &&
               "Features struct sType must be filled with the struct's "
               "corresponding VkStructureType enum");
        assert(node.sType != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 &&
               "Do not pass VkPhysicalDeviceFeatures2 as a required extension feature structure. An "
               "instance of this is managed internally for selection criteria and device creation.");
    }
#endif

    if (criteria.require_present && !criteria.defer_surface_initialization) {
        if (instance_info.surface == VK_NULL_HANDLE)
            return Result<std::vector<PhysicalDevice>>{ PhysicalDeviceError::no_surface_provided };
    }

    // Get the VkPhysicalDevice handles on the system
    std::vector<VkPhysicalDevice> vk_physical_devices;

    auto vk_physical_devices_ret = detail::get_vector<VkPhysicalDevice>(
        vk_physical_devices, detail::vulkan_functions().fp_vkEnumeratePhysicalDevices, instance_info.instance);
    if (vk_physical_devices_ret != VK_SUCCESS) {
        return Result<std::vector<PhysicalDevice>>{ PhysicalDeviceError::failed_enumerate_physical_devices, vk_physical_devices_ret };
    }
    if (vk_physical_devices.size() == 0) {
        return Result<std::vector<PhysicalDevice>>{ PhysicalDeviceError::no_physical_devices_found };
    }

    auto fill_out_phys_dev_with_criteria = [&](PhysicalDevice& phys_dev) {
        phys_dev.features = criteria.required_features;
        phys_dev.extended_features_chain = criteria.extended_features_chain;
        bool portability_ext_available = false;
        for (const auto& ext : phys_dev.available_extensions)
            if (criteria.enable_portability_subset && ext == "VK_KHR_portability_subset")
                portability_ext_available = true;


        phys_dev.extensions_to_enable.clear();
        phys_dev.extensions_to_enable.insert(
            phys_dev.extensions_to_enable.end(), criteria.required_extensions.begin(), criteria.required_extensions.end());
        if (portability_ext_available) {
            phys_dev.extensions_to_enable.push_back("VK_KHR_portability_subset");
        }
    };

    // if this option is set, always return only the first physical device found
    if (criteria.use_first_gpu_unconditionally && vk_physical_devices.size() > 0) {
        PhysicalDevice physical_device = populate_device_details(vk_physical_devices[0], criteria.extended_features_chain);
        fill_out_phys_dev_with_criteria(physical_device);
        return std::vector<PhysicalDevice>{ physical_device };
    }

    // Populate their details and check their suitability
    std::vector<PhysicalDevice> physical_devices;
    for (auto& vk_physical_device : vk_physical_devices) {
        PhysicalDevice phys_dev = populate_device_details(vk_physical_device, criteria.extended_features_chain);
        phys_dev.suitable = is_device_suitable(phys_dev);
        if (phys_dev.suitable != PhysicalDevice::Suitable::no) {
            physical_devices.push_back(phys_dev);
        }
    }

    // sort the list into fully and partially suitable devices. use stable_partition to maintain relative order
    std::stable_partition(physical_devices.begin(), physical_devices.end(), [](auto const& pd) {
        return pd.suitable == PhysicalDevice::Suitable::yes;
    });

    // Make the physical device ready to be used to create a Device from it
    for (auto& physical_device : physical_devices) {
        fill_out_phys_dev_with_criteria(physical_device);
    }

    return physical_devices;
}